

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::NeuralNetworkClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,
          NeuralNetworkClassifier *modelParameters,bool allowEmptyLabels,
          bool defaultClassLabelIsInt64,ValidationPolicy *validationPolicy)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  byte unaff_BPL;
  Result *this_00;
  undefined7 in_register_00000089;
  undefined1 *interface;
  allocator<char> local_49;
  Result result;
  
  iVar1 = *(int *)((long)&model[2].super_MessageLite._vptr_MessageLite + 4);
  cVar3 = (char)modelParameters;
  if (iVar1 == 0) {
    if (cVar3 != '\0') goto LAB_00276712;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"Classifier models must provide class labels.",&local_49);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
  }
  else if (iVar1 == 100) {
    if ((cVar3 == '\0') && (*(int *)(*(long *)&model[1]._cached_size_ + 0x18) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "Classifier declared to have String class labels must provide labels.",&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    }
    else {
      if (Specification::_Int64Vector_default_instance_._16_4_ == 0) {
        allowEmptyLabels = false;
        goto LAB_00276712;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    }
  }
  else {
    allowEmptyLabels = (bool)unaff_BPL;
    if (iVar1 != 0x65) {
LAB_00276712:
      interface = *(undefined1 **)(this + 0x10);
      if ((ModelDescription *)interface == (ModelDescription *)0x0) {
        interface = Specification::_ModelDescription_default_instance_;
      }
      validateFeatureDescriptions<CoreML::Specification::ModelDescription>
                (&result,(ModelDescription *)interface,*(int *)(this + 0x18),
                 (ValidationPolicy *)CONCAT71(in_register_00000089,defaultClassLabelIsInt64));
      bVar2 = Result::good(&result);
      if (bVar2) {
        validateClassifierFeatureDescriptions
                  (__return_storage_ptr__,(ModelDescription *)interface,(bool)(allowEmptyLabels & 1)
                  );
      }
      else {
        Result::Result(__return_storage_ptr__,&result);
      }
      this_00 = (Result *)&result.m_message;
      goto LAB_002767bf;
    }
    if ((cVar3 == '\0') && (*(int *)(*(long *)&model[1]._cached_size_ + 0x10) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "Classifier declared to have Int64 class labels must provide labels.",&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    }
    else {
      if (Specification::_StringVector_default_instance_._24_4_ == 0) {
        allowEmptyLabels = true;
        goto LAB_00276712;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                 ,&local_49);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    }
  }
  this_00 = &result;
LAB_002767bf:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false,
                                       const ValidationPolicy& validationPolicy = ValidationPolicy()) {

        bool expected_class_is_int64;

        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }

                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }

                expected_class_is_int64 = true;

                break;

            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }

                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }

                expected_class_is_int64 = false;

                break;

            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();

            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion(), validationPolicy);
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }